

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1gload.c
# Opt level: O3

FT_Error T1_Load_Glyph(FT_GlyphSlot t1glyph,FT_Size t1size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Pos *pFVar1;
  byte *pbVar2;
  FT_Outline *outline;
  char cVar3;
  short sVar4;
  FT_Face pFVar5;
  undefined8 *puVar6;
  FT_Slot_Internal pFVar7;
  FT_Incremental_InterfaceRec *pFVar8;
  uint uVar9;
  int iVar10;
  FT_Fixed FVar11;
  long lVar12;
  int iVar13;
  FT_Face pFVar14;
  uint uVar15;
  FT_GlyphSlot pFVar16;
  long *plVar17;
  bool bVar18;
  undefined1 local_c68 [8];
  T1_DecoderRec decoder;
  FT_BBox cbox;
  FT_Data glyph_data;
  undefined1 auStack_78 [8];
  FT_Matrix font_matrix;
  FT_Bool local_31 [8];
  FT_Bool force_scaling;
  
  pFVar5 = t1glyph->face;
  local_31[0] = '\0';
  puVar6 = *(undefined8 **)(pFVar5[3].family_name + 0x18);
  if ((glyph_index < (uint)pFVar5->num_glyphs) ||
     (pFVar5->internal->incremental_interface != (FT_Incremental_InterfaceRec *)0x0)) {
    uVar9 = load_flags | 3;
    if (((uint)load_flags >> 10 & 1) == 0) {
      uVar9 = load_flags;
    }
    if (t1size == (FT_Size)0x0) {
      pFVar14 = (FT_Face)0x10000;
      pFVar16 = (FT_GlyphSlot)0x10000;
    }
    else {
      pFVar14 = (FT_Face)(t1size->metrics).x_scale;
      pFVar16 = (FT_GlyphSlot)(t1size->metrics).y_scale;
    }
    t1glyph[1].face = pFVar14;
    t1glyph[1].next = pFVar16;
    (t1glyph->outline).n_contours = 0;
    (t1glyph->outline).n_points = 0;
    bVar18 = (uVar9 & 3) == 0;
    *(bool *)&t1glyph[1].library = bVar18;
    *(byte *)((long)&t1glyph[1].library + 1) = (byte)(uVar9 & 1) ^ 1;
    t1glyph->format = FT_GLYPH_FORMAT_OUTLINE;
    iVar10 = (*(code *)*puVar6)(local_c68,pFVar5,t1size,t1glyph,pFVar5[2].glyph,pFVar5[3].bbox.xMin,
                                bVar18,uVar9 >> 0x10 & 0xf,T1_Parse_Glyph);
    if (iVar10 == 0) {
      decoder.builder.bbox.yMax._5_1_ = (undefined1)((uVar9 & 0x400) >> 10);
      decoder.glyph_names._4_4_ = (undefined4)pFVar5[2].bbox.yMin;
      decoder._2712_8_ = pFVar5[2].bbox.xMax;
      decoder.subrs = (FT_Byte **)pFVar5[2].bbox.yMax;
      decoder.subrs_len = *(FT_UInt **)&pFVar5[2].units_per_EM;
      decoder.funcs.parse_charstrings =
           (_func_FT_Error_PS_Decoder_ptr_FT_Byte_ptr_FT_ULong *)pFVar5[3].bbox.yMax;
      decoder.buildchar._0_4_ = (undefined4)pFVar5[3].bbox.xMax;
      iVar10 = T1_Parse_Glyph_And_Get_Char_String
                         ((T1_Decoder_conflict)local_c68,glyph_index,(FT_Data *)&cbox.yMax,local_31)
      ;
      if (iVar10 == 0) {
        cVar3 = *(char *)&t1glyph[1].library;
        font_matrix.xy._0_4_ = (undefined4)decoder.font_matrix.xy;
        font_matrix.xy._4_4_ = decoder.font_matrix.xy._4_4_;
        font_matrix.yx._0_4_ = (int)decoder.font_matrix.yx;
        font_matrix.yx._4_4_ = decoder.font_matrix.yx._4_4_;
        auStack_78._0_4_ = (int)decoder.subrs_hash;
        auStack_78._4_4_ = decoder.subrs_hash._4_4_;
        font_matrix.xx._0_4_ = (undefined4)decoder.font_matrix.xx;
        font_matrix.xx._4_4_ = decoder.font_matrix.xx._4_4_;
        (*(code *)puVar6[1])();
        (t1glyph->outline).flags = (t1glyph->outline).flags & 1U | 4;
        if ((uVar9 & 0x400) == 0) {
          FVar11 = FT_RoundFix(decoder.builder.left_bearing.y);
          (t1glyph->metrics).horiAdvance = FVar11 >> 0x10;
          FVar11 = FT_RoundFix(decoder.builder.left_bearing.y);
          t1glyph->linearHoriAdvance = FVar11 >> 0x10;
          t1glyph->internal->glyph_transformed = '\0';
          if ((uVar9 & 0x10) == 0) {
            FVar11 = FT_RoundFix(decoder.builder.advance.x);
            (t1glyph->metrics).vertAdvance = FVar11 >> 0x10;
            FVar11 = FT_RoundFix(decoder.builder.advance.x);
            lVar12 = FVar11 >> 0x10;
          }
          else {
            lVar12 = pFVar5[3].face_index - (long)pFVar5[2].internal >> 0x10;
            (t1glyph->metrics).vertAdvance = lVar12;
          }
          t1glyph->linearVertAdvance = lVar12;
          t1glyph->format = FT_GLYPH_FORMAT_OUTLINE;
          if ((t1size != (FT_Size)0x0) && ((t1size->metrics).y_ppem < 0x18)) {
            pbVar2 = (byte *)((long)&(t1glyph->outline).flags + 1);
            *pbVar2 = *pbVar2 | 1;
          }
          outline = &t1glyph->outline;
          if ((((CONCAT44(auStack_78._4_4_,auStack_78._0_4_) != 0x10000) ||
               (CONCAT44(font_matrix.yx._4_4_,(int)font_matrix.yx) != 0x10000)) ||
              (CONCAT44(font_matrix.xx._4_4_,(undefined4)font_matrix.xx) != 0)) ||
             (CONCAT44(font_matrix.xy._4_4_,(undefined4)font_matrix.xy) != 0)) {
            FT_Outline_Transform(outline,(FT_Matrix *)auStack_78);
            lVar12 = (long)(int)auStack_78._0_4_ * (long)(int)(t1glyph->metrics).horiAdvance;
            (t1glyph->metrics).horiAdvance =
                 (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
            lVar12 = (long)(int)font_matrix.yx * (long)(int)(t1glyph->metrics).vertAdvance;
            (t1glyph->metrics).vertAdvance =
                 (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
          }
          if (decoder.font_matrix.yy != 0 || decoder.font_offset.x != 0) {
            FT_Outline_Translate(outline,decoder.font_matrix.yy,decoder.font_offset.x);
            pFVar1 = &(t1glyph->metrics).horiAdvance;
            *pFVar1 = *pFVar1 + decoder.font_matrix.yy;
            pFVar1 = &(t1glyph->metrics).vertAdvance;
            *pFVar1 = *pFVar1 + decoder.font_offset.x;
          }
          if (((uVar9 & 1) == 0) || (local_31[0] != '\0')) {
            iVar13 = (int)t1glyph[1].face;
            iVar10 = (int)t1glyph[1].next;
            if ((cVar3 == '\0') || (decoder.builder._128_8_ == 0)) {
              sVar4 = *(short *)((long)&(decoder.builder.loader)->memory + 2);
              if (0 < sVar4) {
                plVar17 = *(long **)&(decoder.builder.loader)->max_points;
                uVar15 = (int)sVar4 + 1;
                do {
                  lVar12 = (long)(int)*plVar17 * (long)iVar13;
                  *plVar17 = (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
                  lVar12 = (long)(int)plVar17[1] * (long)iVar10;
                  plVar17[1] = (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
                  plVar17 = plVar17 + 2;
                  uVar15 = uVar15 - 1;
                } while (1 < uVar15);
              }
            }
            lVar12 = (long)iVar13 * (long)(int)(t1glyph->metrics).horiAdvance;
            (t1glyph->metrics).horiAdvance =
                 (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
            lVar12 = (long)iVar10 * (long)(int)(t1glyph->metrics).vertAdvance;
            (t1glyph->metrics).vertAdvance =
                 (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
          }
          FT_Outline_Get_CBox(outline,(FT_BBox *)&decoder.cf2_instance.finalizer);
          (t1glyph->metrics).width = cbox.yMin - (long)decoder.cf2_instance.finalizer;
          (t1glyph->metrics).height = cbox.xMax - cbox.xMin;
          (t1glyph->metrics).horiBearingX = (FT_Pos)decoder.cf2_instance.finalizer;
          (t1glyph->metrics).horiBearingY = cbox.xMax;
          if ((uVar9 & 0x10) != 0) {
            ft_synthesize_vertical_metrics(&t1glyph->metrics,(t1glyph->metrics).vertAdvance);
          }
        }
        else {
          pFVar7 = t1glyph->internal;
          FVar11 = FT_RoundFix(decoder.builder.pos_y);
          (t1glyph->metrics).horiBearingX = FVar11 >> 0x10;
          FVar11 = FT_RoundFix(decoder.builder.left_bearing.y);
          (t1glyph->metrics).horiAdvance = FVar11 >> 0x10;
          (pFVar7->glyph_matrix).xx = CONCAT44(auStack_78._4_4_,auStack_78._0_4_);
          (pFVar7->glyph_matrix).xy = CONCAT44(font_matrix.xx._4_4_,(undefined4)font_matrix.xx);
          (pFVar7->glyph_matrix).yx = CONCAT44(font_matrix.xy._4_4_,(undefined4)font_matrix.xy);
          (pFVar7->glyph_matrix).yy = CONCAT44(font_matrix.yx._4_4_,(int)font_matrix.yx);
          (pFVar7->glyph_delta).x = decoder.font_matrix.yy;
          (pFVar7->glyph_delta).y = decoder.font_offset.x;
          pFVar7->glyph_transformed = '\x01';
        }
        t1glyph->control_data = (void *)cbox.yMax;
        t1glyph->control_len = (long)(int)glyph_data.pointer;
        pFVar8 = pFVar5->internal->incremental_interface;
        iVar10 = 0;
        if (pFVar8 != (FT_Incremental_InterfaceRec *)0x0) {
          (*pFVar8->funcs->free_glyph_data)(pFVar8->object,(FT_Data *)&cbox.yMax);
          t1glyph->control_data = (void *)0x0;
          t1glyph->control_len = 0;
          iVar10 = 0;
        }
      }
      else {
        (*(code *)puVar6[1])(local_c68);
      }
    }
  }
  else {
    iVar10 = 6;
  }
  return iVar10;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Load_Glyph( FT_GlyphSlot  t1glyph,          /* T1_GlyphSlot */
                 FT_Size       t1size,           /* T1_Size      */
                 FT_UInt       glyph_index,
                 FT_Int32      load_flags )
  {
    T1_GlyphSlot            glyph = (T1_GlyphSlot)t1glyph;
    FT_Error                error;
    T1_DecoderRec           decoder;
    T1_Face                 face = (T1_Face)t1glyph->face;
    FT_Bool                 hinting;
    FT_Bool                 scaled;
    FT_Bool                 force_scaling = FALSE;
    T1_Font                 type1         = &face->type1;
    PSAux_Service           psaux         = (PSAux_Service)face->psaux;
    const T1_Decoder_Funcs  decoder_funcs = psaux->t1_decoder_funcs;

    FT_Matrix               font_matrix;
    FT_Vector               font_offset;
    FT_Data                 glyph_data;
    FT_Bool                 must_finish_decoder = FALSE;
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Bool                 glyph_data_loaded = 0;
#endif


#ifdef FT_CONFIG_OPTION_INCREMENTAL
    if ( glyph_index >= (FT_UInt)face->root.num_glyphs &&
         !face->root.internal->incremental_interface   )
#else
    if ( glyph_index >= (FT_UInt)face->root.num_glyphs )
#endif /* FT_CONFIG_OPTION_INCREMENTAL */
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_TRACE1(( "T1_Load_Glyph: glyph index %d\n", glyph_index ));

    FT_ASSERT( ( face->len_buildchar == 0 ) == ( face->buildchar == NULL ) );

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE | FT_LOAD_NO_HINTING;

    if ( t1size )
    {
      glyph->x_scale = t1size->metrics.x_scale;
      glyph->y_scale = t1size->metrics.y_scale;
    }
    else
    {
      glyph->x_scale = 0x10000L;
      glyph->y_scale = 0x10000L;
    }

    t1glyph->outline.n_points   = 0;
    t1glyph->outline.n_contours = 0;

    hinting = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 &&
                       ( load_flags & FT_LOAD_NO_HINTING ) == 0 );
    scaled  = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 );

    glyph->hint     = hinting;
    glyph->scaled   = scaled;
    t1glyph->format = FT_GLYPH_FORMAT_OUTLINE;

    error = decoder_funcs->init( &decoder,
                                 t1glyph->face,
                                 t1size,
                                 t1glyph,
                                 (FT_Byte**)type1->glyph_names,
                                 face->blend,
                                 FT_BOOL( hinting ),
                                 FT_LOAD_TARGET_MODE( load_flags ),
                                 T1_Parse_Glyph );
    if ( error )
      goto Exit;

    must_finish_decoder = TRUE;

    decoder.builder.no_recurse = FT_BOOL(
                                   ( load_flags & FT_LOAD_NO_RECURSE ) != 0 );

    decoder.num_subrs     = type1->num_subrs;
    decoder.subrs         = type1->subrs;
    decoder.subrs_len     = type1->subrs_len;
    decoder.subrs_hash    = type1->subrs_hash;

    decoder.buildchar     = face->buildchar;
    decoder.len_buildchar = face->len_buildchar;

    /* now load the unscaled outline */
    error = T1_Parse_Glyph_And_Get_Char_String( &decoder, glyph_index,
                                                &glyph_data,
                                                &force_scaling );
    if ( error )
      goto Exit;
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    glyph_data_loaded = 1;
#endif

    hinting     = glyph->hint;
    font_matrix = decoder.font_matrix;
    font_offset = decoder.font_offset;

    /* save new glyph tables */
    decoder_funcs->done( &decoder );

    must_finish_decoder = FALSE;

    /* now, set the metrics -- this is rather simple, as   */
    /* the left side bearing is the xMin, and the top side */
    /* bearing the yMax                                    */
    if ( !error )
    {
      t1glyph->outline.flags &= FT_OUTLINE_OWNER;
      t1glyph->outline.flags |= FT_OUTLINE_REVERSE_FILL;

      /* for composite glyphs, return only left side bearing and */
      /* advance width                                           */
      if ( load_flags & FT_LOAD_NO_RECURSE )
      {
        FT_Slot_Internal  internal = t1glyph->internal;


        t1glyph->metrics.horiBearingX =
          FIXED_TO_INT( decoder.builder.left_bearing.x );
        t1glyph->metrics.horiAdvance  =
          FIXED_TO_INT( decoder.builder.advance.x );

        internal->glyph_matrix      = font_matrix;
        internal->glyph_delta       = font_offset;
        internal->glyph_transformed = 1;
      }
      else
      {
        FT_BBox            cbox;
        FT_Glyph_Metrics*  metrics = &t1glyph->metrics;


        /* copy the _unscaled_ advance width */
        metrics->horiAdvance =
          FIXED_TO_INT( decoder.builder.advance.x );
        t1glyph->linearHoriAdvance =
          FIXED_TO_INT( decoder.builder.advance.x );
        t1glyph->internal->glyph_transformed = 0;

        if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
        {
          /* make up vertical ones */
          metrics->vertAdvance = ( face->type1.font_bbox.yMax -
                                   face->type1.font_bbox.yMin ) >> 16;
          t1glyph->linearVertAdvance = metrics->vertAdvance;
        }
        else
        {
          metrics->vertAdvance =
            FIXED_TO_INT( decoder.builder.advance.y );
          t1glyph->linearVertAdvance =
            FIXED_TO_INT( decoder.builder.advance.y );
        }

        t1glyph->format = FT_GLYPH_FORMAT_OUTLINE;

        if ( t1size && t1size->metrics.y_ppem < 24 )
          t1glyph->outline.flags |= FT_OUTLINE_HIGH_PRECISION;

#if 1
        /* apply the font matrix, if any */
        if ( font_matrix.xx != 0x10000L || font_matrix.yy != 0x10000L ||
             font_matrix.xy != 0        || font_matrix.yx != 0        )
        {
          FT_Outline_Transform( &t1glyph->outline, &font_matrix );

          metrics->horiAdvance = FT_MulFix( metrics->horiAdvance,
                                            font_matrix.xx );
          metrics->vertAdvance = FT_MulFix( metrics->vertAdvance,
                                            font_matrix.yy );
        }

        if ( font_offset.x || font_offset.y )
        {
          FT_Outline_Translate( &t1glyph->outline,
                                font_offset.x,
                                font_offset.y );

          metrics->horiAdvance += font_offset.x;
          metrics->vertAdvance += font_offset.y;
        }
#endif

        if ( ( load_flags & FT_LOAD_NO_SCALE ) == 0 || force_scaling )
        {
          /* scale the outline and the metrics */
          FT_Int       n;
          FT_Outline*  cur = decoder.builder.base;
          FT_Vector*   vec = cur->points;
          FT_Fixed     x_scale = glyph->x_scale;
          FT_Fixed     y_scale = glyph->y_scale;


          /* First of all, scale the points, if we are not hinting */
          if ( !hinting || ! decoder.builder.hints_funcs )
            for ( n = cur->n_points; n > 0; n--, vec++ )
            {
              vec->x = FT_MulFix( vec->x, x_scale );
              vec->y = FT_MulFix( vec->y, y_scale );
            }

          /* Then scale the metrics */
          metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
          metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
        }

        /* compute the other metrics */
        FT_Outline_Get_CBox( &t1glyph->outline, &cbox );

        metrics->width  = cbox.xMax - cbox.xMin;
        metrics->height = cbox.yMax - cbox.yMin;

        metrics->horiBearingX = cbox.xMin;
        metrics->horiBearingY = cbox.yMax;

        if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
        {
          /* make up vertical ones */
          ft_synthesize_vertical_metrics( metrics,
                                          metrics->vertAdvance );
        }
      }

      /* Set control data to the glyph charstrings.  Note that this is */
      /* _not_ zero-terminated.                                        */
      t1glyph->control_data = (FT_Byte*)glyph_data.pointer;
      t1glyph->control_len  = glyph_data.length;
    }


  Exit:

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    if ( glyph_data_loaded && face->root.internal->incremental_interface )
    {
      face->root.internal->incremental_interface->funcs->free_glyph_data(
        face->root.internal->incremental_interface->object,
        &glyph_data );

      /* Set the control data to null - it is no longer available if   */
      /* loaded incrementally.                                         */
      t1glyph->control_data = NULL;
      t1glyph->control_len  = 0;
    }
#endif

    if ( must_finish_decoder )
      decoder_funcs->done( &decoder );

    return error;
  }